

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O0

uint64_t hashmap_sip(void *data,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  uint64_t seed1_local;
  uint64_t seed0_local;
  size_t len_local;
  void *data_local;
  
  uVar1 = SIP64((uint8_t *)data,len,seed0,seed1);
  return uVar1;
}

Assistant:

uint64_t hashmap_sip(const void *data, size_t len, uint64_t seed0,
    uint64_t seed1)
{
    return SIP64((uint8_t*)data, len, seed0, seed1);
}